

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_sequence_adapter.hpp
# Opt level: O2

bool asio::detail::
     buffer_sequence_adapter<asio::const_buffer,asio::detail::prepared_buffers<asio::const_buffer,64ul>>
     ::all_empty<asio::const_buffer_const*>(const_buffer *begin,const_buffer *end)

{
  size_t i;
  
  i = 0;
  for (; (0x3f >= i && begin != end && (begin->size_ == 0)); begin = begin + 1) {
    i = i + 1;
  }
  return 0x3f < i || begin == end;
}

Assistant:

static bool all_empty(Iterator begin, Iterator end)
  {
    Iterator iter = begin;
    std::size_t i = 0;
    for (; iter != end && i < max_buffers; ++iter, ++i)
      if (Buffer(*iter).size() > 0)
        return false;
    return true;
  }